

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPlotIO.cpp
# Opt level: O3

void __thiscall NaDPlotFile::AppendRecord(NaDPlotFile *this)

{
  long *plVar1;
  int iVar2;
  undefined4 extraout_var;
  uint uVar3;
  
  this->iCase = this->iCase + 1;
  plVar1 = &(this->super_NaDataFile).nRecords;
  *plVar1 = *plVar1 + 1;
  if (0 < (this->aVars).nItems) {
    uVar3 = 0;
    do {
      iVar2 = (*(this->aVars)._vptr_NaDynAr[0xf])(&this->aVars,(ulong)uVar3);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x20))
                ((long *)CONCAT44(extraout_var,iVar2),(int)(this->super_NaDataFile).nRecords);
      uVar3 = uVar3 + 1;
    } while ((int)uVar3 < (this->aVars).nItems);
  }
  return;
}

Assistant:

void    NaDPlotFile::AppendRecord ()
{
    ++iCase;
    ++nRecords;
    int iVar;
    for(iVar = 0; iVar < aVars.count(); ++iVar){
        aVars[iVar].new_dim(nRecords);
    }
}